

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall
Catch::(anonymous_namespace)::formatDuration_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,double seconds)

{
  long lVar1;
  long lVar2;
  ReusableStringStream rss;
  ReusableStringStream local_20;
  
  ReusableStringStream::ReusableStringStream(&local_20);
  lVar1 = *(long *)local_20.m_oss;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(local_20.m_oss + lVar2 + 0x18) =
       *(uint *)(local_20.m_oss + lVar2 + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(local_20.m_oss + *(long *)(lVar1 + -0x18) + 8) = 3;
  std::ostream::_M_insert<double>(seconds);
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string formatDuration( double seconds ) {
            ReusableStringStream rss;
            rss << std::fixed << std::setprecision( 3 ) << seconds;
            return rss.str();
        }